

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::enqueuePart
          (QPDFWriter *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (part->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                (part->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_38,p_Var2);
    enqueueObject(this,(QPDFObjectHandle *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void
QPDFWriter::enqueuePart(std::vector<QPDFObjectHandle>& part)
{
    for (auto const& oh: part) {
        enqueueObject(oh);
    }
}